

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O2

int If_CutCompareDelayOld(If_Man_t *p,If_Cut_t **ppC0,If_Cut_t **ppC1)

{
  float fVar1;
  If_Cut_t *pIVar2;
  If_Cut_t *pIVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  
  pIVar2 = *ppC0;
  pIVar3 = *ppC1;
  fVar1 = p->fEpsilon;
  iVar4 = -1;
  if (pIVar2->Delay < pIVar3->Delay - fVar1) {
    return iVar4;
  }
  iVar5 = 1;
  if (pIVar2->Delay <= pIVar3->Delay + fVar1) {
    if (pIVar2->Area < pIVar3->Area - fVar1) {
      return iVar4;
    }
    if (pIVar2->Area <= fVar1 + pIVar3->Area) {
      uVar7 = *(uint *)&pIVar2->field_0x1c >> 0x18;
      uVar6 = *(uint *)&pIVar3->field_0x1c >> 0x18;
      iVar5 = iVar4;
      if (uVar6 <= uVar7) {
        return (int)(uVar6 < uVar7);
      }
    }
  }
  return iVar5;
}

Assistant:

int If_CutCompareDelayOld( If_Man_t * p, If_Cut_t ** ppC0, If_Cut_t ** ppC1 )
{
    If_Cut_t * pC0 = *ppC0;
    If_Cut_t * pC1 = *ppC1;
    if ( pC0->Delay < pC1->Delay - p->fEpsilon )
        return -1;
    if ( pC0->Delay > pC1->Delay + p->fEpsilon )
        return 1;
    if ( pC0->Area < pC1->Area - p->fEpsilon )
        return -1;
    if ( pC0->Area > pC1->Area + p->fEpsilon )
        return 1;
    if ( pC0->nLeaves < pC1->nLeaves )
        return -1;
    if ( pC0->nLeaves > pC1->nLeaves )
        return 1;
    return 0;
}